

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFParser::parse(QPDFParser *this,bool *empty,bool content_stream)

{
  InputSource *pIVar1;
  bool bVar2;
  token_type_e tVar3;
  undefined8 uVar4;
  string *psVar5;
  reference pvVar6;
  char *str;
  qpdf_offset_t qVar7;
  byte in_CL;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar8;
  shared_ptr<QPDFObject> local_1e8;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0 [8];
  string s;
  string local_188;
  shared_ptr<QPDFObject> local_168;
  string *local_158;
  string *value;
  shared_ptr<QPDFObject> local_148;
  undefined1 local_135;
  parser_state_e local_134;
  shared_ptr<QPDFObject> local_130;
  allocator<char> local_119;
  string local_118;
  shared_ptr<QPDFObject> local_f8;
  allocator<char> local_e1;
  string local_e0;
  shared_ptr<QPDFObject> local_c0;
  allocator<char> local_a9;
  string local_a8;
  shared_ptr<QPDFObject> local_88;
  shared_ptr<QPDFObject> local_78;
  allocator<char> local_61;
  string local_60;
  undefined4 local_40;
  ParseGuard local_30;
  ParseGuard pg;
  bool content_stream_local;
  bool *empty_local;
  QPDFParser *this_local;
  
  pg.qpdf._7_1_ = in_CL & 1;
  QPDF::ParseGuard::ParseGuard(&local_30,*(QPDF **)(empty + 0x20));
  *(undefined1 *)CONCAT71(in_register_00000011,content_stream) = 0;
  uVar4 = (**(code **)(**(long **)empty + 0x20))();
  *(undefined8 *)(empty + 0x78) = uVar4;
  bVar2 = ::qpdf::Tokenizer::nextToken
                    (*(Tokenizer **)(empty + 0x10),*(InputSource **)empty,*(string **)(empty + 8),0)
  ;
  if (!bVar2) {
    psVar5 = ::qpdf::Tokenizer::getErrorMessage_abi_cxx11_(*(Tokenizer **)(empty + 0x10));
    warn((QPDFParser *)empty,psVar5);
  }
  tVar3 = ::qpdf::Tokenizer::getType(*(Tokenizer **)(empty + 0x10));
  switch(tVar3) {
  case tt_bad:
    QTC::TC("qpdf","QPDFParser bad token in parse",0);
    QPDFObject::create<QPDF_Null>();
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_88);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_88);
    local_40 = 1;
    break;
  case tt_array_close:
    QTC::TC("qpdf","QPDFParser bad array close",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"treating unexpected array close token as null",&local_e1);
    warn((QPDFParser *)empty,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    QPDFObject::create<QPDF_Null>();
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_f8);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_f8);
    local_40 = 1;
    break;
  case tt_array_open:
  case tt_dict_open:
    std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::clear
              ((vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_> *)
               (empty + 0x48));
    pIVar1 = *(InputSource **)empty;
    tVar3 = ::qpdf::Tokenizer::getType(*(Tokenizer **)(empty + 0x10));
    local_134 = (uint)(tVar3 == tt_array_open) * 2;
    std::vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>>::
    emplace_back<InputSource&,QPDFParser::parser_state_e>
              ((vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>> *)
               (empty + 0x48),pIVar1,&local_134);
    pvVar6 = std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::back
                       ((vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_> *)
                        (empty + 0x48));
    *(reference *)(empty + 0x60) = pvVar6;
    parseRemainder(this,SUB81(empty,0));
    local_40 = 1;
    break;
  case tt_brace_close:
  case tt_brace_open:
    QTC::TC("qpdf","QPDFParser bad brace",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"treating unexpected brace token as null",&local_a9);
    warn((QPDFParser *)empty,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    QPDFObject::create<QPDF_Null>();
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_c0);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_c0);
    local_40 = 1;
    break;
  case tt_dict_close:
    QTC::TC("qpdf","QPDFParser bad dictionary close",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"unexpected dictionary close token",&local_119);
    warn((QPDFParser *)empty,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    QPDFObject::create<QPDF_Null>();
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_130);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_130);
    local_40 = 1;
    break;
  case tt_integer:
    ::qpdf::Tokenizer::getValue_abi_cxx11_(*(Tokenizer **)(empty + 0x10));
    str = (char *)std::__cxx11::string::c_str();
    value = (string *)QUtil::string_to_ll(str);
    withDescription<QPDF_Integer,long_long>(this,(longlong *)empty);
    local_40 = 1;
    break;
  case tt_name:
    ::qpdf::Tokenizer::getValue_abi_cxx11_(*(Tokenizer **)(empty + 0x10));
    withDescription<QPDF_Name,std::__cxx11::string_const&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
    local_40 = 1;
    break;
  case tt_real:
    ::qpdf::Tokenizer::getValue_abi_cxx11_(*(Tokenizer **)(empty + 0x10));
    withDescription<QPDF_Real,std::__cxx11::string_const&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
    local_40 = 1;
    break;
  case tt_string:
    if (*(long *)(empty + 0x18) == 0) {
      ::qpdf::Tokenizer::getValue_abi_cxx11_(*(Tokenizer **)(empty + 0x10));
      withDescription<QPDF_String,std::__cxx11::string_const&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
      local_40 = 1;
    }
    else {
      psVar5 = ::qpdf::Tokenizer::getValue_abi_cxx11_(*(Tokenizer **)(empty + 0x10));
      std::__cxx11::string::string(local_1b0,(string *)psVar5);
      (**(code **)(**(long **)(empty + 0x18) + 0x10))(*(long **)(empty + 0x18),local_1b0);
      withDescription<QPDF_String,std::__cxx11::string&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
      local_40 = 1;
      std::__cxx11::string::~string(local_1b0);
    }
    break;
  case tt_null:
    QPDFObject::create<QPDF_Null>();
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_148);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_148);
    local_40 = 1;
    break;
  case tt_bool:
    psVar5 = ::qpdf::Tokenizer::getValue_abi_cxx11_(*(Tokenizer **)(empty + 0x10));
    local_135 = std::operator==(psVar5,"true");
    withDescription<QPDF_Bool,bool>(this,empty);
    local_40 = 1;
    break;
  case tt_word:
    local_158 = ::qpdf::Tokenizer::getValue_abi_cxx11_(*(Tokenizer **)(empty + 0x10));
    if ((pg.qpdf._7_1_ & 1) == 0) {
      bVar2 = std::operator==(local_158,"endobj");
      if (bVar2) {
        pIVar1 = *(InputSource **)empty;
        qVar7 = InputSource::getLastOffset(pIVar1);
        (*pIVar1->_vptr_InputSource[5])(pIVar1,qVar7,0);
        *(undefined1 *)CONCAT71(in_register_00000011,content_stream) = 1;
        QPDFObject::create<QPDF_Null>();
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_168);
        std::shared_ptr<QPDFObject>::~shared_ptr(&local_168);
        local_40 = 1;
      }
      else {
        QTC::TC("qpdf","QPDFParser treat word as string",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"unknown token while reading object; treating as string",
                   (allocator<char> *)(s.field_2._M_local_buf + 0xf));
        warn((QPDFParser *)empty,&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator((allocator<char> *)(s.field_2._M_local_buf + 0xf));
        withDescription<QPDF_String,std::__cxx11::string_const&>
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
        local_40 = 1;
      }
    }
    else {
      withDescription<QPDF_Operator,std::__cxx11::string_const&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
      local_40 = 1;
    }
    break;
  case tt_eof:
    if ((pg.qpdf._7_1_ & 1) == 0) {
      QTC::TC("qpdf","QPDFParser eof in parse",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"unexpected EOF",&local_61);
      warn((QPDFParser *)empty,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      QPDFObject::create<QPDF_Null>();
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_78);
      std::shared_ptr<QPDFObject>::~shared_ptr(&local_78);
      local_40 = 1;
    }
    else {
      memset(this,0,0x10);
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this);
      local_40 = 1;
    }
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"treating unknown token type as null while reading object",
               &local_1d1);
    warn((QPDFParser *)empty,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    QPDFObject::create<QPDF_Null>();
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_1e8);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_1e8);
    local_40 = 1;
  }
  QPDF::ParseGuard::~ParseGuard(&local_30);
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::parse(bool& empty, bool content_stream)
{
    // This method must take care not to resolve any objects. Don't check the type of any object
    // without first ensuring that it is a direct object. Otherwise, doing so may have the side
    // effect of reading the object and changing the file pointer. If you do this, it will cause a
    // logic error to be thrown from QPDF::inParse().

    QPDF::ParseGuard pg(context);
    empty = false;
    start = input.tell();

    if (!tokenizer.nextToken(input, object_description)) {
        warn(tokenizer.getErrorMessage());
    }

    switch (tokenizer.getType()) {
    case QPDFTokenizer::tt_eof:
        if (content_stream) {
            // In content stream mode, leave object uninitialized to indicate EOF
            return {};
        }
        QTC::TC("qpdf", "QPDFParser eof in parse");
        warn("unexpected EOF");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_bad:
        QTC::TC("qpdf", "QPDFParser bad token in parse");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_brace_open:
    case QPDFTokenizer::tt_brace_close:
        QTC::TC("qpdf", "QPDFParser bad brace");
        warn("treating unexpected brace token as null");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_array_close:
        QTC::TC("qpdf", "QPDFParser bad array close");
        warn("treating unexpected array close token as null");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_dict_close:
        QTC::TC("qpdf", "QPDFParser bad dictionary close");
        warn("unexpected dictionary close token");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_array_open:
    case QPDFTokenizer::tt_dict_open:
        stack.clear();
        stack.emplace_back(
            input,
            (tokenizer.getType() == QPDFTokenizer::tt_array_open) ? st_array : st_dictionary_key);
        frame = &stack.back();
        return parseRemainder(content_stream);

    case QPDFTokenizer::tt_bool:
        return withDescription<QPDF_Bool>(tokenizer.getValue() == "true");

    case QPDFTokenizer::tt_null:
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_integer:
        return withDescription<QPDF_Integer>(QUtil::string_to_ll(tokenizer.getValue().c_str()));

    case QPDFTokenizer::tt_real:
        return withDescription<QPDF_Real>(tokenizer.getValue());

    case QPDFTokenizer::tt_name:
        return withDescription<QPDF_Name>(tokenizer.getValue());

    case QPDFTokenizer::tt_word:
        {
            auto const& value = tokenizer.getValue();
            if (content_stream) {
                return withDescription<QPDF_Operator>(value);
            } else if (value == "endobj") {
                // We just saw endobj without having read anything.  Treat this as a null and do
                // not move the input source's offset.
                input.seek(input.getLastOffset(), SEEK_SET);
                empty = true;
                return {QPDFObject::create<QPDF_Null>()};
            } else {
                QTC::TC("qpdf", "QPDFParser treat word as string");
                warn("unknown token while reading object; treating as string");
                return withDescription<QPDF_String>(value);
            }
        }

    case QPDFTokenizer::tt_string:
        if (decrypter) {
            std::string s{tokenizer.getValue()};
            decrypter->decryptString(s);
            return withDescription<QPDF_String>(s);
        } else {
            return withDescription<QPDF_String>(tokenizer.getValue());
        }

    default:
        warn("treating unknown token type as null while reading object");
        return {QPDFObject::create<QPDF_Null>()};
    }
}